

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Repetition.hpp
# Opt level: O3

void InstructionSet::x86::Primitive::
     cmps<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)0,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (Instruction<false> *instruction,unsigned_short *eCX,unsigned_short *eSI,
               unsigned_short *eDI,Context *context)

{
  short sVar1;
  type_conflict2 destination;
  type_conflict2 source;
  
  destination = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)0>
                          (&context->memory,
                           (Source)(instruction->source_data_dest_sib_ >> 10) & BH | ES,*eSI);
  source = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)0>
                     (&context->memory,ES,*eDI);
  sVar1 = (short)(context->flags).direction_ * 2;
  *eSI = *eSI + sVar1;
  *eDI = *eDI + sVar1;
  sub<false,(InstructionSet::x86::AccessType)0,unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            (destination,source,context);
  return;
}

Assistant:

void cmps(
	const InstructionT &instruction,
	AddressT &eCX,
	AddressT &eSI,
	AddressT &eDI,
	ContextT &context
) {
	if(repetition_over<AddressT, repetition>(eCX)) {
		return;
	}

	IntT lhs = context.memory.template access<IntT, AccessType::Read>(instruction.data_segment(), eSI);
	const IntT rhs = context.memory.template access<IntT, AccessType::Read>(Source::ES, eDI);
	eSI += context.flags.template direction<AddressT>() * sizeof(IntT);
	eDI += context.flags.template direction<AddressT>() * sizeof(IntT);

	Primitive::sub<false, AccessType::Read, IntT>(lhs, rhs, context);

	repeat<AddressT, repetition>(eCX, context);
}